

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O3

stream_source<char> * __thiscall
jsoncons::stream_source<char>::operator=(stream_source<char> *this,stream_source<char> *other)

{
  pointer pcVar1;
  stream_source<char> local_1b0;
  
  if ((stream_source<char> *)other->stream_ptr_ == other) {
    this->stream_ptr_ = (basic_istream<char,_std::char_traits<char>_> *)this;
    pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->sbuf_ = *(basic_streambuf<char,_std::char_traits<char>_> **)
                   (&(this->null_is_).super_basic_istream<char,_std::char_traits<char>_>.field_0xe8
                   + (long)(this->null_is_).super_basic_istream<char,_std::char_traits<char>_>.
                           _vptr_basic_istream[-3]);
    this->position_ = 0;
    this->buffer_data_ = pcVar1;
    this->buffer_length_ = 0;
  }
  else {
    this->stream_ptr_ = other->stream_ptr_;
    this->sbuf_ = other->sbuf_;
    this->position_ = other->position_;
    std::vector<char,_std::allocator<char>_>::_M_move_assign(&this->buffer_,&other->buffer_);
    this->buffer_data_ =
         other->buffer_data_ +
         ((long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start -
         (long)(other->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    this->buffer_length_ = other->buffer_length_;
    stream_source(&local_1b0);
    operator=(other,&local_1b0);
    ~stream_source(&local_1b0);
  }
  return this;
}

Assistant:

stream_source& operator=(stream_source&& other) noexcept
        {
            if (other.stream_ptr_ != &other.null_is_)
            {
                stream_ptr_ = other.stream_ptr_;
                sbuf_ = other.sbuf_;
                position_ = other.position_;
                buffer_ = std::move(other.buffer_);
                buffer_data_ = buffer_.data() + (other.buffer_data_ - other.buffer_.data());
                buffer_length_ =  other.buffer_length_;
                other = stream_source();
            }
            else
            {
                stream_ptr_ = &null_is_;
                sbuf_ = null_is_.rdbuf();
                position_ = 0;
                buffer_data_ = buffer_.data();
                buffer_length_ =  0;
            }
            return *this;
        }